

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::AddLogSink(LogSink *destination)

{
  LogDestination::AddLogSink(destination);
  return;
}

Assistant:

void AddLogSink(LogSink *destination) {
  LogDestination::AddLogSink(destination);
}